

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int decode_status_code(uint8_t *value,size_t len)

{
  uint8_t uVar1;
  int local_28;
  int iStack_24;
  char c;
  int res;
  int i;
  size_t len_local;
  uint8_t *value_local;
  
  if (len == 3) {
    local_28 = 0;
    for (iStack_24 = 0; iStack_24 < 3; iStack_24 = iStack_24 + 1) {
      uVar1 = value[iStack_24];
      if (((char)uVar1 < '0') || ('9' < (char)uVar1)) {
        return -1;
      }
      local_28 = (char)uVar1 + -0x30 + local_28 * 10;
    }
    value_local._4_4_ = local_28;
  }
  else {
    value_local._4_4_ = -1;
  }
  return value_local._4_4_;
}

Assistant:

static int decode_status_code(const uint8_t *value, size_t len)
{
  int i;
  int res;

  if(len != 3) {
    return -1;
  }

  res = 0;

  for(i = 0; i < 3; ++i) {
    char c = value[i];

    if(c < '0' || c > '9') {
      return -1;
    }

    res *= 10;
    res += c - '0';
  }

  return res;
}